

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void crypto::sha256_transform::transform(hash_word *state,hash_word *data)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  hash_word hVar7;
  uint uVar8;
  hash_word hVar9;
  hash_word hVar10;
  uint uVar11;
  hash_word hVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint local_fc;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  hash_word local_bc;
  uint local_9c;
  hash_word local_98;
  
  uVar4 = 0;
  local_c4 = 0;
  local_c8 = 0;
  local_cc = 0;
  local_d0 = 0;
  local_d4 = 0;
  local_d8 = 0;
  local_dc = 0;
  local_fc = 0;
  local_e0 = 0;
  local_e4 = 0;
  local_e8 = 0;
  local_ec = 0;
  hVar10 = 0;
  local_c0 = 0;
  local_bc = 0;
  hVar9 = *state;
  hVar12 = state[1];
  uVar5 = state[2];
  hVar7 = state[3];
  uVar3 = state[5];
  uVar8 = state[4];
  local_9c = state[6];
  local_98 = state[7];
  for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 0x10) {
    if (uVar15 == 0) {
      uVar4 = *data;
      local_c4 = data[1];
      local_c8 = data[2];
      local_cc = data[3];
      local_d0 = data[4];
      local_d4 = data[5];
      local_d8 = data[6];
    }
    else {
      uVar4 = uVar4 + local_e0 +
              (local_c4 >> 3 ^
              (local_c4 << 0xe | local_c4 >> 0x12) ^ (local_c4 << 0x19 | local_c4 >> 7)) +
              (local_c0 >> 10 ^
              (local_c0 << 0xd | local_c0 >> 0x13) ^ (local_c0 << 0xf | local_c0 >> 0x11));
      local_c4 = local_c4 + local_e4 +
                 (local_c8 >> 3 ^
                 (local_c8 << 0xe | local_c8 >> 0x12) ^ (local_c8 << 0x19 | local_c8 >> 7)) +
                 (local_bc >> 10 ^
                 (local_bc << 0xd | local_bc >> 0x13) ^ (local_bc << 0xf | local_bc >> 0x11));
      local_c8 = local_c8 + local_e8 +
                 (local_cc >> 3 ^
                 (local_cc << 0xe | local_cc >> 0x12) ^ (local_cc << 0x19 | local_cc >> 7)) +
                 (uVar4 >> 10 ^ (uVar4 * 0x2000 | uVar4 >> 0x13) ^ (uVar4 * 0x8000 | uVar4 >> 0x11))
      ;
      local_cc = local_cc + local_ec +
                 (local_d0 >> 3 ^
                 (local_d0 << 0xe | local_d0 >> 0x12) ^ (local_d0 << 0x19 | local_d0 >> 7)) +
                 (local_c4 >> 10 ^
                 (local_c4 * 0x2000 | local_c4 >> 0x13) ^ (local_c4 * 0x8000 | local_c4 >> 0x11));
      local_d0 = local_d0 + hVar10 +
                 (local_d4 >> 3 ^
                 (local_d4 << 0xe | local_d4 >> 0x12) ^ (local_d4 << 0x19 | local_d4 >> 7)) +
                 (local_c8 >> 10 ^
                 (local_c8 * 0x2000 | local_c8 >> 0x13) ^ (local_c8 * 0x8000 | local_c8 >> 0x11));
      local_d4 = local_d4 + local_c0 +
                 (local_d8 >> 3 ^
                 (local_d8 << 0xe | local_d8 >> 0x12) ^ (local_d8 << 0x19 | local_d8 >> 7)) +
                 (local_cc >> 10 ^
                 (local_cc * 0x2000 | local_cc >> 0x13) ^ (local_cc * 0x8000 | local_cc >> 0x11));
      local_d8 = local_d8 + local_bc +
                 (local_dc >> 3 ^
                 (local_dc << 0xe | local_dc >> 0x12) ^ (local_dc << 0x19 | local_dc >> 7)) +
                 (local_d0 >> 10 ^
                 (local_d0 * 0x2000 | local_d0 >> 0x13) ^ (local_d0 * 0x8000 | local_d0 >> 0x11));
    }
    if (uVar15 == 0) {
      local_dc = data[7];
    }
    else {
      local_dc = (local_fc >> 3 ^
                 (local_fc << 0xe | local_fc >> 0x12) ^ (local_fc << 0x19 | local_fc >> 7)) +
                 local_dc + uVar4 +
                 (local_d4 >> 10 ^
                 (local_d4 << 0xd | local_d4 >> 0x13) ^ (local_d4 << 0xf | local_d4 >> 0x11));
    }
    if (uVar15 == 0) {
      local_fc = data[8];
    }
    else {
      local_fc = (local_e0 >> 3 ^
                 (local_e0 << 0xe | local_e0 >> 0x12) ^ (local_e0 << 0x19 | local_e0 >> 7)) +
                 local_fc + local_c4 +
                 (local_d8 >> 10 ^
                 (local_d8 << 0xd | local_d8 >> 0x13) ^ (local_d8 << 0xf | local_d8 >> 0x11));
    }
    if (uVar15 == 0) {
      local_e0 = data[9];
    }
    else {
      local_e0 = (local_e4 >> 3 ^
                 (local_e4 << 0xe | local_e4 >> 0x12) ^ (local_e4 << 0x19 | local_e4 >> 7)) +
                 local_e0 + local_c8 +
                 (local_dc >> 10 ^
                 (local_dc << 0xd | local_dc >> 0x13) ^ (local_dc << 0xf | local_dc >> 0x11));
    }
    if (uVar15 == 0) {
      local_e4 = data[10];
    }
    else {
      local_e4 = (local_e8 >> 3 ^
                 (local_e8 << 0xe | local_e8 >> 0x12) ^ (local_e8 << 0x19 | local_e8 >> 7)) +
                 local_e4 + local_cc +
                 (local_fc >> 10 ^
                 (local_fc << 0xd | local_fc >> 0x13) ^ (local_fc << 0xf | local_fc >> 0x11));
    }
    if (uVar15 == 0) {
      local_e8 = data[0xb];
    }
    else {
      local_e8 = (local_ec >> 3 ^
                 (local_ec << 0xe | local_ec >> 0x12) ^ (local_ec << 0x19 | local_ec >> 7)) +
                 local_e8 + local_d0 +
                 (local_e0 >> 10 ^
                 (local_e0 << 0xd | local_e0 >> 0x13) ^ (local_e0 << 0xf | local_e0 >> 0x11));
    }
    if (uVar15 == 0) {
      local_ec = data[0xc];
    }
    else {
      local_ec = (hVar10 >> 3 ^ (hVar10 << 0xe | hVar10 >> 0x12) ^ (hVar10 << 0x19 | hVar10 >> 7)) +
                 local_ec + local_d4 +
                 (local_e4 >> 10 ^
                 (local_e4 << 0xd | local_e4 >> 0x13) ^ (local_e4 << 0xf | local_e4 >> 0x11));
    }
    if (uVar15 == 0) {
      hVar10 = data[0xd];
    }
    else {
      hVar10 = (local_c0 >> 3 ^
               (local_c0 << 0xe | local_c0 >> 0x12) ^ (local_c0 << 0x19 | local_c0 >> 7)) + hVar10 +
               local_d8 +
               (local_e8 >> 10 ^
               (local_e8 << 0xd | local_e8 >> 0x13) ^ (local_e8 << 0xf | local_e8 >> 0x11));
    }
    if (uVar15 == 0) {
      local_c0 = data[0xe];
    }
    else {
      local_c0 = (local_bc >> 3 ^
                 (local_bc << 0xe | local_bc >> 0x12) ^ (local_bc << 0x19 | local_bc >> 7)) +
                 local_c0 + local_dc +
                 (local_ec >> 10 ^
                 (local_ec << 0xd | local_ec >> 0x13) ^ (local_ec << 0xf | local_ec >> 0x11));
    }
    if (uVar15 == 0) {
      local_bc = data[0xf];
    }
    else {
      local_bc = (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7)) +
                 local_bc + local_fc +
                 (hVar10 >> 10 ^ (hVar10 << 0xd | hVar10 >> 0x13) ^ (hVar10 << 0xf | hVar10 >> 0x11)
                 );
    }
    iVar2 = ((uVar3 ^ local_9c) & uVar8 ^ local_9c) + local_98 +
            ((uVar8 << 7 | uVar8 >> 0x19) ^
            (uVar8 << 0x15 | uVar8 >> 0xb) ^ (uVar8 << 0x1a | uVar8 >> 6)) + (&sha256_k)[uVar15] +
            uVar4;
    uVar6 = hVar7 + iVar2;
    uVar13 = ((hVar12 ^ uVar5) & (hVar9 ^ hVar12) ^ hVar12) +
             ((hVar9 << 10 | hVar9 >> 0x16) ^
             (hVar9 << 0x13 | hVar9 >> 0xd) ^ (hVar9 << 0x1e | hVar9 >> 2)) + iVar2;
    iVar2 = (&DAT_0014e0b4)[uVar15] + local_9c + ((uVar8 ^ uVar3) & uVar6 ^ uVar3) + local_c4 +
            ((uVar6 * 0x80 | uVar6 >> 0x19) ^
            (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6));
    uVar5 = uVar5 + iVar2;
    uVar1 = ((hVar9 ^ hVar12) & (uVar13 ^ hVar9) ^ hVar9) +
            ((uVar13 * 0x400 | uVar13 >> 0x16) ^
            (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar2;
    iVar2 = (&DAT_0014e0b8)[uVar15] + uVar3 + ((uVar6 ^ uVar8) & uVar5 ^ uVar8) + local_c8 +
            ((uVar5 * 0x80 | uVar5 >> 0x19) ^
            (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
    uVar11 = hVar12 + iVar2;
    uVar3 = ((uVar13 ^ hVar9) & (uVar1 ^ uVar13) ^ uVar13) +
            ((uVar1 * 0x400 | uVar1 >> 0x16) ^
            (uVar1 * 0x80000 | uVar1 >> 0xd) ^ (uVar1 * 0x40000000 | uVar1 >> 2)) + iVar2;
    iVar2 = (&DAT_0014e0bc)[uVar15] + uVar8 + ((uVar5 ^ uVar6) & uVar11 ^ uVar6) + local_cc +
            ((uVar11 * 0x80 | uVar11 >> 0x19) ^
            (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
    uVar8 = hVar9 + iVar2;
    uVar16 = ((uVar1 ^ uVar13) & (uVar3 ^ uVar1) ^ uVar1) +
             ((uVar3 * 0x400 | uVar3 >> 0x16) ^
             (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar2;
    iVar2 = (&DAT_0014e0c0)[uVar15] + uVar6 + ((uVar11 ^ uVar5) & uVar8 ^ uVar5) + local_d0 +
            ((uVar8 * 0x80 | uVar8 >> 0x19) ^
            (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
    uVar13 = uVar13 + iVar2;
    uVar17 = ((uVar3 ^ uVar1) & (uVar16 ^ uVar3) ^ uVar3) +
             ((uVar16 * 0x400 | uVar16 >> 0x16) ^
             (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar2;
    iVar2 = (&DAT_0014e0c4)[uVar15] + uVar5 + ((uVar8 ^ uVar11) & uVar13 ^ uVar11) + local_d4 +
            ((uVar13 * 0x80 | uVar13 >> 0x19) ^
            (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6));
    uVar1 = uVar1 + iVar2;
    uVar14 = ((uVar16 ^ uVar3) & (uVar17 ^ uVar16) ^ uVar16) +
             ((uVar17 * 0x400 | uVar17 >> 0x16) ^
             (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar2;
    iVar2 = (&DAT_0014e0c8)[uVar15] + uVar11 + ((uVar13 ^ uVar8) & uVar1 ^ uVar8) + local_d8 +
            ((uVar1 * 0x80 | uVar1 >> 0x19) ^
            (uVar1 * 0x200000 | uVar1 >> 0xb) ^ (uVar1 * 0x4000000 | uVar1 >> 6));
    uVar3 = uVar3 + iVar2;
    uVar6 = ((uVar17 ^ uVar16) & (uVar14 ^ uVar17) ^ uVar17) +
            ((uVar14 * 0x400 | uVar14 >> 0x16) ^
            (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar2;
    iVar2 = (&DAT_0014e0cc)[uVar15] + uVar8 + ((uVar1 ^ uVar13) & uVar3 ^ uVar13) + local_dc +
            ((uVar3 * 0x80 | uVar3 >> 0x19) ^
            (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6));
    uVar16 = uVar16 + iVar2;
    uVar11 = ((uVar14 ^ uVar17) & (uVar6 ^ uVar14) ^ uVar14) +
             ((uVar6 * 0x400 | uVar6 >> 0x16) ^
             (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar2;
    iVar2 = *(int *)(&DAT_0014e0d0 + uVar15 * 4) + uVar13 + ((uVar3 ^ uVar1) & uVar16 ^ uVar1) +
            local_fc +
            ((uVar16 * 0x80 | uVar16 >> 0x19) ^
            (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6));
    uVar17 = uVar17 + iVar2;
    uVar5 = ((uVar6 ^ uVar14) & (uVar11 ^ uVar6) ^ uVar6) +
            ((uVar11 * 0x400 | uVar11 >> 0x16) ^
            (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar2;
    iVar2 = *(int *)(&DAT_0014e0d4 + uVar15 * 4) + uVar1 + ((uVar16 ^ uVar3) & uVar17 ^ uVar3) +
            local_e0 +
            ((uVar17 * 0x80 | uVar17 >> 0x19) ^
            (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6));
    uVar14 = uVar14 + iVar2;
    uVar1 = ((uVar11 ^ uVar6) & (uVar5 ^ uVar11) ^ uVar11) +
            ((uVar5 * 0x400 | uVar5 >> 0x16) ^
            (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar2;
    iVar2 = *(int *)(&DAT_0014e0d8 + uVar15 * 4) + uVar3 + ((uVar17 ^ uVar16) & uVar14 ^ uVar16) +
            local_e4 +
            ((uVar14 * 0x80 | uVar14 >> 0x19) ^
            (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6));
    uVar6 = uVar6 + iVar2;
    uVar3 = ((uVar5 ^ uVar11) & (uVar1 ^ uVar5) ^ uVar5) +
            ((uVar1 * 0x400 | uVar1 >> 0x16) ^
            (uVar1 * 0x80000 | uVar1 >> 0xd) ^ (uVar1 * 0x40000000 | uVar1 >> 2)) + iVar2;
    iVar2 = *(int *)(&DAT_0014e0dc + uVar15 * 4) + uVar16 + ((uVar14 ^ uVar17) & uVar6 ^ uVar17) +
            local_e8 +
            ((uVar6 * 0x80 | uVar6 >> 0x19) ^
            (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6));
    uVar11 = uVar11 + iVar2;
    uVar8 = ((uVar1 ^ uVar5) & (uVar3 ^ uVar1) ^ uVar1) +
            ((uVar3 * 0x400 | uVar3 >> 0x16) ^
            (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar2;
    iVar2 = *(int *)(&DAT_0014e0e0 + uVar15 * 4) + uVar17 + ((uVar6 ^ uVar14) & uVar11 ^ uVar14) +
            local_ec +
            ((uVar11 * 0x80 | uVar11 >> 0x19) ^
            (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
    local_98 = uVar5 + iVar2;
    hVar7 = ((uVar3 ^ uVar1) & (uVar8 ^ uVar3) ^ uVar3) +
            ((uVar8 * 0x400 | uVar8 >> 0x16) ^
            (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar2;
    iVar2 = *(int *)(&DAT_0014e0e4 + uVar15 * 4) + uVar14 + ((uVar11 ^ uVar6) & local_98 ^ uVar6) +
            hVar10 + ((local_98 * 0x80 | local_98 >> 0x19) ^
                     (local_98 * 0x200000 | local_98 >> 0xb) ^
                     (local_98 * 0x4000000 | local_98 >> 6));
    local_9c = uVar1 + iVar2;
    uVar5 = ((uVar8 ^ uVar3) & (hVar7 ^ uVar8) ^ uVar8) +
            ((hVar7 * 0x400 | hVar7 >> 0x16) ^
            (hVar7 * 0x80000 | hVar7 >> 0xd) ^ (hVar7 * 0x40000000 | hVar7 >> 2)) + iVar2;
    iVar2 = *(int *)(&DAT_0014e0e8 + uVar15 * 4) + uVar6 + ((local_98 ^ uVar11) & local_9c ^ uVar11)
            + local_c0 +
            ((local_9c * 0x80 | local_9c >> 0x19) ^
            (local_9c * 0x200000 | local_9c >> 0xb) ^ (local_9c * 0x4000000 | local_9c >> 6));
    uVar3 = uVar3 + iVar2;
    hVar12 = ((hVar7 ^ uVar8) & (uVar5 ^ hVar7) ^ hVar7) +
             ((uVar5 * 0x400 | uVar5 >> 0x16) ^
             (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar2;
    iVar2 = *(int *)(&DAT_0014e0ec + uVar15 * 4) + uVar11 +
            ((local_9c ^ local_98) & uVar3 ^ local_98) + local_bc +
            ((uVar3 * 0x80 | uVar3 >> 0x19) ^
            (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6));
    uVar8 = uVar8 + iVar2;
    hVar9 = ((hVar12 ^ uVar5) & (uVar5 ^ hVar7) ^ uVar5) +
            ((hVar12 * 0x400 | hVar12 >> 0x16) ^
            (hVar12 * 0x80000 | hVar12 >> 0xd) ^ (hVar12 * 0x40000000 | hVar12 >> 2)) + iVar2;
  }
  *state = hVar9 + *state;
  state[1] = hVar12 + state[1];
  state[2] = uVar5 + state[2];
  state[3] = hVar7 + state[3];
  state[4] = uVar8 + state[4];
  state[5] = uVar3 + state[5];
  state[6] = local_9c + state[6];
  state[7] = local_98 + state[7];
  return;
}

Assistant:

void sha256_transform::transform(hash_word * state, const hash_word * data) {
	
	#define a(i) T[(0 - i) & 7]
	#define b(i) T[(1 - i) & 7]
	#define c(i) T[(2 - i) & 7]
	#define d(i) T[(3 - i) & 7]
	#define e(i) T[(4 - i) & 7]
	#define f(i) T[(5 - i) & 7]
	#define g(i) T[(6 - i) & 7]
	#define h(i) T[(7 - i) & 7]
	
	#define blk0(i) (W[i] = data[i])
	#define blk2(i) (W[i & 15] += s1(W[(i - 2) & 15]) + W[(i - 7) & 15] + s0(W[(i - 15) & 15]))
	
	#define Ch(x, y, z) (z ^ (x & (y ^ z)))
	#define Maj(x, y, z) (y ^ ((x ^ y) & (y ^ z)))
	
	#define R(i) \
		h(i) += S1(e(i)) + Ch(e(i), f(i), g(i)) + sha256_k[i + j] + (j ? blk2(i) : blk0(i)); \
		d(i) += h(i); \
		h(i) += S0(a(i)) + Maj(a(i), b(i), c(i))
	
	#define s0(x) (util::rotr_fixed(x, 7) ^ util::rotr_fixed(x, 18) ^ (x >> 3))
	#define s1(x) (util::rotr_fixed(x, 17) ^ util::rotr_fixed(x, 19) ^ (x >> 10))
	#define S0(x) (util::rotr_fixed(x, 2) ^ util::rotr_fixed(x, 13) ^ util::rotr_fixed(x, 22))
	#define S1(x) (util::rotr_fixed(x, 6) ^ util::rotr_fixed(x, 11) ^ util::rotr_fixed(x, 25))
	
	hash_word W[16] = {0}, T[8];
	
	/* Copy context->state to working vars */
	std::memcpy(T, state, sizeof(T));
	
	/* 64 operations, partially loop unrolled */
	for(size_t j = 0; j < 64; j += 16) {
		R(0);
		R(1);
		R(2);
		R(3);
		R(4);
		R(5);
		R(6);
		R(7);
		R(8);
		R(9);
		R(10);
		R(11);
		R(12);
		R(13);
		R(14);
		R(15);
	}
	
	/* Add the working vars back into context.state[] */
	state[0] += a(0);
	state[1] += b(0);
	state[2] += c(0);
	state[3] += d(0);
	state[4] += e(0);
	state[5] += f(0);
	state[6] += g(0);
	state[7] += h(0);
	
	#undef Ch
	#undef Maj
	#undef s0
	#undef s1
	#undef S0
	#undef S1
	#undef blk0
	#undef blk1
	#undef blk2
	#undef R
	
	#undef a
	#undef b
	#undef c
	#undef d
	#undef e
	#undef f
	#undef g
	#undef h
	
}